

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cellml_1_1.cpp
# Opt level: O2

void __thiscall
ParserTransform_cellmlNsCn_Test::~ParserTransform_cellmlNsCn_Test
          (ParserTransform_cellmlNsCn_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ParserTransform, cellmlNsCn)
{
    libcellml::ParserPtr parser = libcellml::Parser::create(false);
    auto model = parser->parseModel(fileContents("cellml1X/cellml_ns_cn.cellml"));

    EXPECT_EQ(size_t(2), model->unitsCount());
    EXPECT_EQ(size_t(3), model->componentCount());
    EXPECT_EQ(size_t(1), parser->issueCount());

    auto validator = libcellml::Validator::create();
    validator->validateModel(model);

    EXPECT_EQ(size_t(0), validator->issueCount());
}